

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::QueryPool>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  deUint32 dVar1;
  Resources *pRVar2;
  reference pvVar3;
  CreateThread<vkt::api::(anonymous_namespace)::QueryPool> *this_00;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_101;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_100;
  SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources> local_f0;
  uint local_dc;
  undefined1 local_d8 [4];
  deUint32 ndx;
  ThreadGroup threads;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_> local_91;
  undefined1 local_90 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  resources;
  Environment env;
  deUint32 numThreads;
  Context *context_local;
  Context *local_20;
  Parameters params_local;
  
  params_local.queryType = params.queryType;
  local_20 = context;
  unique0x10000310 = __return_storage_ptr__;
  dVar1 = getDefaultTestThreadCount();
  Environment::Environment
            ((Environment *)
             &resources.
              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Context *)this,1);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>::allocator
            (&local_91);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
            *)local_90,(ulong)dVar1,&local_91);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>::~allocator
            (&local_91);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_d8);
  for (local_dc = 0; local_dc < dVar1; local_dc = local_dc + 1) {
    pRVar2 = (Resources *)operator_new(1);
    QueryPool::Resources::Resources
              (pRVar2,(Environment *)
                      &resources.
                       super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(Parameters *)&local_20);
    de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>::SharedPtr
              (&local_f0,pRVar2);
    pvVar3 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                           *)local_90,(ulong)local_dc);
    de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>::operator=
              (pvVar3,&local_f0);
    de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>::~SharedPtr(&local_f0);
    this_00 = (CreateThread<vkt::api::(anonymous_namespace)::QueryPool> *)operator_new(0x88);
    pvVar3 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                           *)local_90,(ulong)local_dc);
    pRVar2 = de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>::operator*(pvVar3)
    ;
    CreateThread<vkt::api::(anonymous_namespace)::QueryPool>::CreateThread
              (this_00,(Environment *)
                       &resources.
                        super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pRVar2,
               (Parameters *)&local_20);
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter
              (&local_101);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_100,this_00);
    ThreadGroup::add((ThreadGroup *)local_d8,&local_100);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_100);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_d8);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_d8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
             *)local_90);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}